

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

int __thiscall CTcPrsOpBinGroup::find_and_apply_op(CTcPrsOpBinGroup *this,CTcPrsNode **lhs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  CTcPrsNode *pCVar4;
  undefined4 extraout_var_01;
  CTcPrsOpBin **ppCVar5;
  long lVar3;
  undefined4 extraout_var_00;
  
  ppCVar5 = this->ops_;
  while( true ) {
    if (*ppCVar5 == (CTcPrsOpBin *)0x0) {
      return 0;
    }
    if ((G_tok->curtok_).typ_ == (*ppCVar5)->op_tok_) break;
    ppCVar5 = ppCVar5 + 1;
  }
  CTcTokenizer::next(G_tok);
  iVar1 = (**this->right_->_vptr_CTcPrsOp)();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (lVar3 == 0) {
    pCVar4 = (CTcPrsNode *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = (*((*ppCVar5)->super_CTcPrsOp)._vptr_CTcPrsOp[2])(*ppCVar5,*lhs,lVar3);
    pCVar4 = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = 1;
    if (pCVar4 == (CTcPrsNode *)0x0) {
      iVar2 = (*((*ppCVar5)->super_CTcPrsOp)._vptr_CTcPrsOp[1])(*ppCVar5,*lhs,lVar3);
      pCVar4 = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  *lhs = pCVar4;
  return iVar1;
}

Assistant:

int CTcPrsOpBinGroup::find_and_apply_op(CTcPrsNode **lhs) const
{
    /* check each operator at this precedence level */
    for (const CTcPrsOpBin *const *op = ops_ ; *op != 0 ; ++op)
    {
        /* check this operator's token */
        if (G_tok->cur() == (*op)->get_op_tok())
        {
            /* skip the operator token */
            G_tok->next();

            /* parse the right-hand side */
            CTcPrsNode *rhs = right_->parse();
            if (rhs == 0)
            {
                /* error - cancel the entire expression */
                *lhs = 0;
                return FALSE;
            }

            /* try folding our subnodes into a constant value */
            CTcPrsNode *const_tree = (*op)->eval_constant(*lhs, rhs);

            /* 
             *   if we couldn't calculate a constant value, build the tree
             *   normally 
             */
            if (const_tree == 0)
            {
                /* 
                 *   build my tree, replacing the original left-hand side
                 *   with the new expression 
                 */
                *lhs = (*op)->build_tree(*lhs, rhs);
            }
            else
            {
                /* we got a constant value - use it as the result */
                *lhs = const_tree;
            }

            /*
             *   Tell the caller to proceed to parse any additional
             *   occurrences of our operator - this will apply the next
             *   occurrence of the operator as the left-hand side of the
             *   new operator.  
             */
            return TRUE;
        }
    }

    /* 
     *   if we got here, we didn't find an operator - tell the caller that
     *   we've reached the end of this operator's possible span
     */
    return FALSE;
}